

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O2

BOOL __thiscall
Js::DynamicObject::SetObjectArrayItemWritable
          (DynamicObject *this,PropertyId propertyId,BOOL writable)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  bVar1 = HasObjectArray(this);
  if (bVar1) {
    iVar2 = (**(code **)(**(long **)&(this->field_1).field_1 + 0x1d8))
                      (*(long **)&(this->field_1).field_1,propertyId,writable);
    uVar3 = (uint)(iVar2 != 0);
    if ((writable == 0) && (iVar2 != 0)) {
      InvalidateHasOnlyWritableDataPropertiesInPrototypeChainCacheIfPrototype(this);
    }
  }
  else {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

BOOL DynamicObject::SetObjectArrayItemWritable(PropertyId propertyId, BOOL writable)
    {
        const auto result = HasObjectArray() && GetObjectArrayOrFlagsAsArray()->SetWritable(propertyId, writable);
        if (!writable && result)
        {
            InvalidateHasOnlyWritableDataPropertiesInPrototypeChainCacheIfPrototype();
        }
        return result;
    }